

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::EncodeActiveOperationalDataset
                  (Error *__return_storage_ptr__,Request *aRequest,
                  ActiveOperationalDataset *aDataset)

{
  ActiveOperationalDataset *pAVar1;
  bool bVar2;
  uint64_t aValue;
  Error *pEVar3;
  ErrorCode local_3ec;
  Tlv local_3e8;
  Error local_3c8;
  uchar *local_3a0;
  uchar *local_398;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_390;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_388;
  const_iterator local_380;
  undefined1 local_378 [8];
  ByteArray value_2;
  Tlv local_358;
  Error local_338;
  ErrorCode local_30c;
  Tlv local_308;
  Error local_2e8;
  ErrorCode local_2bc;
  Tlv local_2b8;
  Error local_298;
  ErrorCode local_26c;
  Tlv local_268;
  Error local_248;
  ErrorCode local_21c;
  Tlv local_218;
  Error local_1f8;
  ErrorCode local_1cc;
  Tlv local_1c8;
  Error local_1a8;
  ErrorCode local_17c;
  Tlv local_178;
  Error local_158;
  ErrorCode local_12c;
  Error local_128;
  undefined1 local_100 [8];
  ByteArray value_1;
  Tlv local_e0;
  Error local_c0;
  undefined1 local_98 [8];
  ByteArray value;
  Tlv local_70;
  Error local_50;
  byte local_21;
  ActiveOperationalDataset *local_20;
  ActiveOperationalDataset *aDataset_local;
  Request *aRequest_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aDataset;
  aDataset_local = (ActiveOperationalDataset *)aRequest;
  aRequest_local = (Request *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  pAVar1 = aDataset_local;
  if ((local_20->mPresentFlags & 0x8000) == 0) {
LAB_00242ede:
    if ((local_20->mPresentFlags & 0x4000) == 0) {
LAB_00243071:
      if ((local_20->mPresentFlags & 0x2000) != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
        EncodeChannelMask(&local_128,(ByteArray *)local_100,&local_20->mChannelMask);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_128);
        local_12c = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_12c);
        Error::~Error(&local_128);
        pAVar1 = aDataset_local;
        if (bVar2) {
          value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
        }
        else {
          tlv::Tlv::Tlv(&local_178,kChannelMask,(ByteArray *)local_100,kMeshCoP);
          AppendTlv(&local_158,(Message *)pAVar1,&local_178);
          pEVar3 = Error::operator=(__return_storage_ptr__,&local_158);
          local_17c = kNone;
          bVar2 = commissioner::operator!=(pEVar3,&local_17c);
          Error::~Error(&local_158);
          tlv::Tlv::~Tlv(&local_178);
          if (bVar2) {
            value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
          }
          else {
            value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
        if ((int)value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) goto joined_r0x00243053;
      }
      pAVar1 = aDataset_local;
      if ((local_20->mPresentFlags & 0x1000) != 0) {
        tlv::Tlv::Tlv(&local_1c8,kExtendedPanId,&local_20->mExtendedPanId,kMeshCoP);
        AppendTlv(&local_1a8,(Message *)pAVar1,&local_1c8);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_1a8);
        local_1cc = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_1cc);
        Error::~Error(&local_1a8);
        tlv::Tlv::~Tlv(&local_1c8);
        if (bVar2) goto LAB_00243a53;
      }
      pAVar1 = aDataset_local;
      if ((local_20->mPresentFlags & 0x800) != 0) {
        tlv::Tlv::Tlv(&local_218,kNetworkDiagNetworkData,&local_20->mMeshLocalPrefix,kMeshCoP);
        AppendTlv(&local_1f8,(Message *)pAVar1,&local_218);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_1f8);
        local_21c = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_21c);
        Error::~Error(&local_1f8);
        tlv::Tlv::~Tlv(&local_218);
        if (bVar2) goto LAB_00243a53;
      }
      pAVar1 = aDataset_local;
      if ((local_20->mPresentFlags & 0x400) != 0) {
        tlv::Tlv::Tlv(&local_268,kNetworkDiagRoute64,&local_20->mNetworkMasterKey,kMeshCoP);
        AppendTlv(&local_248,(Message *)pAVar1,&local_268);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_248);
        local_26c = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_26c);
        Error::~Error(&local_248);
        tlv::Tlv::~Tlv(&local_268);
        if (bVar2) goto LAB_00243a53;
      }
      pAVar1 = aDataset_local;
      if ((local_20->mPresentFlags & 0x200) != 0) {
        tlv::Tlv::Tlv(&local_2b8,kNetworkDiagTimeout,&local_20->mNetworkName,kMeshCoP);
        AppendTlv(&local_298,(Message *)pAVar1,&local_2b8);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_298);
        local_2bc = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_2bc);
        Error::~Error(&local_298);
        tlv::Tlv::~Tlv(&local_2b8);
        if (bVar2) goto LAB_00243a53;
      }
      pAVar1 = aDataset_local;
      if ((local_20->mPresentFlags & 0x100) != 0) {
        tlv::Tlv::Tlv(&local_308,kNetworkDiagMacAddress,local_20->mPanId,kMeshCoP);
        AppendTlv(&local_2e8,(Message *)pAVar1,&local_308);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_2e8);
        local_30c = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_30c);
        Error::~Error(&local_2e8);
        tlv::Tlv::~Tlv(&local_308);
        if (bVar2) goto LAB_00243a53;
      }
      pAVar1 = aDataset_local;
      if ((local_20->mPresentFlags & 0x80) != 0) {
        tlv::Tlv::Tlv(&local_358,kNetworkDiagConnectivity,&local_20->mPSKc,kMeshCoP);
        AppendTlv(&local_338,(Message *)pAVar1,&local_358);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_338);
        value_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        bVar2 = commissioner::operator!=
                          (pEVar3,(ErrorCode *)
                                  ((long)&value_2.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        Error::~Error(&local_338);
        tlv::Tlv::~Tlv(&local_358);
        if (bVar2) goto LAB_00243a53;
      }
      if ((local_20->mPresentFlags & 0x40) != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
        utils::Encode<unsigned_short>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378,
                   (local_20->mSecurityPolicy).mRotationTime);
        local_388._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378)
        ;
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_380,&local_388);
        local_390._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (&(local_20->mSecurityPolicy).mFlags);
        local_398 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                       (&(local_20->mSecurityPolicy).mFlags);
        local_3a0 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                             insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                       ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                        local_378,local_380,local_390,
                                        (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         )local_398);
        pAVar1 = aDataset_local;
        tlv::Tlv::Tlv(&local_3e8,kSecurityPolicy,(ByteArray *)local_378,kMeshCoP);
        AppendTlv(&local_3c8,(Message *)pAVar1,&local_3e8);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_3c8);
        local_3ec = kNone;
        bVar2 = commissioner::operator!=(pEVar3,&local_3ec);
        Error::~Error(&local_3c8);
        tlv::Tlv::~Tlv(&local_3e8);
        if (bVar2) {
          value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
        }
        else {
          value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_378);
        if ((int)value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) goto joined_r0x00243053;
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
      utils::Encode<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                 (local_20->mChannel).mPage);
      utils::Encode<unsigned_short>((ByteArray *)local_98,(local_20->mChannel).mNumber);
      pAVar1 = aDataset_local;
      tlv::Tlv::Tlv(&local_e0,kChannel,(ByteArray *)local_98,kMeshCoP);
      AppendTlv(&local_c0,(Message *)pAVar1,&local_e0);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_c0);
      value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      bVar2 = commissioner::operator!=
                        (pEVar3,(ErrorCode *)
                                ((long)&value_1.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Error::~Error(&local_c0);
      tlv::Tlv::~Tlv(&local_e0);
      if (bVar2) {
        value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      }
      else {
        value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
      if ((int)value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0) goto LAB_00243071;
joined_r0x00243053:
      if ((int)value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != 4) goto LAB_00243a61;
    }
  }
  else {
    aValue = Timestamp::Encode(&local_20->mActiveTimestamp);
    tlv::Tlv::Tlv(&local_70,kActiveTimestamp,aValue,kMeshCoP);
    AppendTlv(&local_50,(Message *)pAVar1,&local_70);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_50);
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    bVar2 = commissioner::operator!=
                      (pEVar3,(ErrorCode *)
                              &value.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    Error::~Error(&local_50);
    tlv::Tlv::~Tlv(&local_70);
    if (!bVar2) goto LAB_00242ede;
  }
LAB_00243a53:
  local_21 = 1;
  value_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
LAB_00243a61:
  if ((local_21 & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeActiveOperationalDataset(coap::Request                  &aRequest,
                                                       const ActiveOperationalDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kActiveTimestampBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kActiveTimestamp, aDataset.mActiveTimestamp.Encode()}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit)
    {
        ByteArray value;
        utils::Encode(value, aDataset.mChannel.mPage);
        utils::Encode(value, aDataset.mChannel.mNumber);
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kChannel, value}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit)
    {
        ByteArray value;
        SuccessOrExit(error = EncodeChannelMask(value, aDataset.mChannelMask));
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kChannelMask, value}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kExtendedPanIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kExtendedPanId, aDataset.mExtendedPanId}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkMeshLocalPrefix, aDataset.mMeshLocalPrefix}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkMasterKey, aDataset.mNetworkMasterKey}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kNetworkNameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNetworkName, aDataset.mNetworkName}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPanId, aDataset.mPanId}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kPSKcBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPSKc, aDataset.mPSKc}));
    }

    if (aDataset.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit)
    {
        ByteArray value;
        utils::Encode(value, aDataset.mSecurityPolicy.mRotationTime);
        value.insert(value.end(), aDataset.mSecurityPolicy.mFlags.begin(), aDataset.mSecurityPolicy.mFlags.end());
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kSecurityPolicy, value}));
    }

exit:
    return error;
}